

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend.cpp
# Opt level: O2

QString * __thiscall
QTlsBackend::shortNameForId(QString *__return_storage_ptr__,QTlsBackend *this,int cid)

{
  QLoggingCategory *pQVar1;
  QDebug *pQVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_70;
  undefined4 local_58;
  undefined8 local_54;
  undefined8 uStack_4c;
  undefined4 local_44;
  char *local_40;
  QDebug local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QtPrivateLogging::lcSsl();
  if (((pQVar1->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
    local_40 = pQVar1->name;
    local_58 = 2;
    local_54 = 0;
    uStack_4c = 0;
    local_44 = 0;
    QMessageLogger::warning();
    pQVar2 = QDebug::operator<<(&local_38,"The backend");
    (**(code **)(*(long *)this + 0x90))(&local_70,this);
    pQVar2 = QDebug::operator<<(pQVar2,(QString *)&local_70);
    QDebug::operator<<(pQVar2,"does not support QSslEllipticCurve");
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QDebug::~QDebug(&local_38);
  }
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QTlsBackend::shortNameForId(int cid) const
{
    Q_UNUSED(cid);
    REPORT_MISSING_SUPPORT("does not support QSslEllipticCurve");
    return {};
}